

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O1

shared_device_buffer * __thiscall
gpu::shared_device_buffer::operator=(shared_device_buffer *this,shared_device_buffer *other)

{
  long *plVar1;
  
  if (this != other) {
    decref(this);
    plVar1 = (long *)other->buffer_;
    this->buffer_ = (uchar *)plVar1;
    this->data_ = other->data_;
    this->type_ = other->type_;
    this->size_ = other->size_;
    this->offset_ = other->offset_;
    if (plVar1 != (long *)0x0) {
      LOCK();
      *plVar1 = *plVar1 + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

shared_device_buffer &shared_device_buffer::operator= (const shared_device_buffer &other)
{
	if (this != &other) {
		decref();
		buffer_	= other.buffer_;
		data_	= other.data_;
		type_	= other.type_;
		size_	= other.size_;
		offset_	= other.offset_;
		incref();
	}

	return *this;
}